

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall
Json::BuiltStyledStreamWriter::BuiltStyledStreamWriter
          (BuiltStyledStreamWriter *this,string *indentation,Enum cs,string *colonSymbol,
          string *nullSymbol,string *endingLineFeedSymbol)

{
  undefined1 in_CL;
  undefined7 in_register_00000009;
  undefined4 in_EDX;
  string *in_RSI;
  StreamWriter *in_RDI;
  string *in_R8;
  string *in_R9;
  
  StreamWriter::StreamWriter(in_RDI);
  in_RDI->_vptr_StreamWriter = (_func_int **)&PTR__BuiltStyledStreamWriter_0017dc38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1667ed);
  std::__cxx11::string::string((string *)&in_RDI[2].sout_);
  *(undefined4 *)&in_RDI[4].sout_ = 0x4a;
  std::__cxx11::string::string((string *)(in_RDI + 5),in_RSI);
  *(undefined4 *)&in_RDI[7]._vptr_StreamWriter = in_EDX;
  std::__cxx11::string::string
            ((string *)&in_RDI[7].sout_,(string *)CONCAT71(in_register_00000009,in_CL));
  std::__cxx11::string::string((string *)&in_RDI[9].sout_,in_R8);
  std::__cxx11::string::string((string *)&in_RDI[0xb].sout_,in_R9);
  *(byte *)&in_RDI[0xd].sout_ = *(byte *)&in_RDI[0xd].sout_ & 0xfe;
  *(byte *)&in_RDI[0xd].sout_ = *(byte *)&in_RDI[0xd].sout_ & 0xfd;
  return;
}

Assistant:

BuiltStyledStreamWriter::BuiltStyledStreamWriter(
      std::string const& indentation,
      CommentStyle::Enum cs,
      std::string const& colonSymbol,
      std::string const& nullSymbol,
      std::string const& endingLineFeedSymbol)
  : rightMargin_(74)
  , indentation_(indentation)
  , cs_(cs)
  , colonSymbol_(colonSymbol)
  , nullSymbol_(nullSymbol)
  , endingLineFeedSymbol_(endingLineFeedSymbol)
  , addChildValues_(false)
  , indented_(false)
{
}